

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lockstep_scheduler_test.cpp
# Opt level: O0

void test_condition_timing_out(void)

{
  thread thread;
  atomic<bool> should_have_timed_out;
  LockstepScheduler ls;
  pthread_mutex_t lock;
  pthread_cond_t cond;
  pthread_mutex_t *__mutex;
  undefined1 __i;
  pthread_mutexattr_t *__mutexattr;
  LockstepScheduler *in_stack_ffffffffffffff20;
  thread *in_stack_ffffffffffffff40;
  type local_b5 [2];
  uint64_t in_stack_ffffffffffffff98;
  LockstepScheduler *in_stack_ffffffffffffffa0;
  pthread_mutex_t local_58;
  pthread_cond_t local_30;
  
  __mutexattr = (pthread_mutexattr_t *)0x0;
  pthread_cond_init(&local_30,(pthread_condattr_t *)0x0);
  pthread_mutex_init(&local_58,__mutexattr);
  LockstepScheduler::LockstepScheduler(in_stack_ffffffffffffff20);
  LockstepScheduler::set_absolute_time(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  local_b5[0].ls._0_1_ = 0;
  __mutex = &local_58;
  pthread_mutex_lock(__mutex);
  __i = (undefined1)((ulong)__mutex >> 0x38);
  std::thread::thread<test_condition_timing_out()::__0,,void>(in_stack_ffffffffffffff40,local_b5);
  LockstepScheduler::set_absolute_time(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  std::atomic<bool>::operator=((atomic<bool> *)__mutexattr->__size,(bool)__i);
  LockstepScheduler::set_absolute_time(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  std::thread::join();
  pthread_mutex_destroy(&local_58);
  pthread_cond_destroy(&local_30);
  std::thread::~thread((thread *)0x10f4f1);
  LockstepScheduler::~LockstepScheduler((LockstepScheduler *)0x10f4fb);
  return;
}

Assistant:

void test_condition_timing_out()
{
    // Create locked condition.
    pthread_cond_t cond;
    pthread_cond_init(&cond, NULL);

    // And a lock which needs to be locked
    pthread_mutex_t lock;
    pthread_mutex_init(&lock, NULL);

    LockstepScheduler ls;
    ls.set_absolute_time(some_time_us);

    std::atomic<bool> should_have_timed_out{false};
    pthread_mutex_lock(&lock);

    // Use a thread to wait for condition while we already have the lock.
    // This ensures the synchronization happens in the right order.
    std::thread thread([&ls, &cond, &lock, &should_have_timed_out]() {
        assert(ls.cond_timedwait(&cond, &lock, some_time_us + 1000) == -1);
        assert(errno == ETIMEDOUT);
        assert(should_have_timed_out);
        // It should be re-locked afterwards, so we should be able to unlock it.
        assert(pthread_mutex_unlock(&lock) == 0);
    });

    ls.set_absolute_time(some_time_us + 500);
    should_have_timed_out = true;
    ls.set_absolute_time(some_time_us + 1500);

    thread.join();

    pthread_mutex_destroy(&lock);
    pthread_cond_destroy(&cond);

}